

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O3

ConcatStringMulti *
Js::ConcatStringMulti::New
          (uint slotCount,JavascriptString *a1,JavascriptString *a2,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this;
  undefined4 *puVar4;
  ConcatStringMulti *this_00;
  StaticType *stringTypeStatic;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  local_68 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_61797a7;
  data.filename._0_4_ = 0x213;
  data.typeinfo = (type_info *)((ulong)slotCount * 8);
  data._32_8_ = a1;
  this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00b2e5a9;
    *puVar4 = 0;
  }
  this_00 = (ConcatStringMulti *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                      (this,(size_t)((type_info *)((ulong)slotCount * 8) + 0x30));
  if (this_00 == (ConcatStringMulti *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00b2e5a9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  stringTypeStatic =
       StringCache::GetStringTypeStatic
                 (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
  ConcatStringMulti(this_00,slotCount,(JavascriptString *)data._32_8_,a2,stringTypeStatic);
  return this_00;
}

Assistant:

ConcatStringMulti*
    ConcatStringMulti::New(uint slotCount, JavascriptString * a1, JavascriptString * a2, ScriptContext * scriptContext)
    {
        return RecyclerNewPlus(scriptContext->GetRecycler(),
            sizeof(JavascriptString *) * slotCount, ConcatStringMulti, slotCount, a1, a2,
            scriptContext->GetLibrary()->GetStringTypeStatic());
    }